

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_draw_vertex_element
               (void *dst,float *values,int value_count,nk_draw_vertex_layout_format format)

{
  undefined4 uVar1;
  char cVar2;
  char cVar3;
  short sVar4;
  int iVar5;
  double in_RAX;
  short sVar6;
  char *src0;
  long lVar7;
  bool bVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  char value;
  undefined7 uStack_37;
  
  if (7 < (uint)value_count) {
    __assert_fail("format < NK_FORMAT_COLOR_BEGIN",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x24fe,
                  "void nk_draw_vertex_element(void *, const float *, int, enum nk_draw_vertex_layout_format)"
                 );
  }
  lVar7 = 0;
  _value = in_RAX;
  do {
    if (lVar7 == 8) {
      return;
    }
    uVar1 = uStack_37._3_4_;
    switch((long)&switchD_0013e507::switchdataD_001576a0 +
           (long)(int)(&switchD_0013e507::switchdataD_001576a0)[(uint)value_count]) {
    case 0x13e509:
      fVar10 = *(float *)((long)values + lVar7);
      cVar2 = (fVar10 < -127.0) * '\x02' + '\x7f';
      if (127.0 <= fVar10) {
        cVar2 = '\x7f';
      }
      cVar3 = (char)(int)fVar10;
      if (127.0 <= fVar10) {
        cVar3 = cVar2;
      }
      if (fVar10 < -127.0) {
        cVar3 = cVar2;
      }
      break;
    case 0x13e549:
      fVar10 = *(float *)((long)values + lVar7);
      fVar11 = 0.0;
      sVar4 = (fVar10 < 0.0 && fVar10 < 65535.0) - 1;
      bVar9 = fVar10 == 65535.0;
      bVar8 = 65535.0 < fVar10;
LAB_0013e636:
      sVar6 = (short)(int)fVar10;
      if (bVar8 || bVar9) {
        sVar6 = sVar4;
      }
      if (fVar10 < fVar11) {
        sVar6 = sVar4;
      }
      _value = (double)CONCAT62(uStack_37._1_6_,sVar6);
      nk_memcopy(dst,&value,2);
      dst = (void *)((long)dst + 2);
      goto LAB_0013e6a0;
    case 0x13e575:
      fVar10 = *(float *)((long)values + lVar7);
      iVar5 = (int)fVar10;
      if (2.1474836e+09 <= fVar10) {
        iVar5 = -0x80000000;
      }
      if (fVar10 < -2.1474836e+09) {
        iVar5 = -0x80000000;
      }
      goto LAB_0013e685;
    case 0x13e5a8:
      fVar10 = *(float *)((long)values + lVar7);
      cVar3 = (char)(int)fVar10;
      if (256.0 <= fVar10) {
        cVar3 = '\0';
      }
      if (fVar10 < 0.0) {
        cVar3 = '\0';
      }
      break;
    case 0x13e5e7:
      _value = (double)*(float *)((long)values + lVar7);
      nk_memcopy(dst,&value,8);
      dst = (void *)((long)dst + 8);
      goto LAB_0013e6a0;
    case 0x13e609:
      fVar10 = *(float *)((long)values + lVar7);
      fVar11 = -32767.0;
      sVar4 = (ushort)(fVar10 < -32767.0) * 2 + 0x7fff;
      bVar9 = fVar10 == 32767.0;
      bVar8 = 32767.0 < fVar10;
      if (32767.0 <= fVar10) {
        sVar4 = 0x7fff;
      }
      goto LAB_0013e636;
    case 0x13e65b:
      fVar10 = *(float *)((long)values + lVar7);
      iVar5 = (int)(long)fVar10;
      if (4.2949673e+09 <= fVar10) {
        iVar5 = 0;
      }
      if (fVar10 < 0.0) {
        iVar5 = 0;
      }
LAB_0013e685:
      _value = (double)CONCAT44(uVar1,iVar5);
      src0 = &value;
LAB_0013e694:
      nk_memcopy(dst,src0,4);
      dst = (void *)((long)dst + 4);
      goto LAB_0013e6a0;
    case 0x13e68d:
      src0 = (undefined1 *)((long)values + lVar7);
      goto LAB_0013e694;
    }
    _value = (double)CONCAT71(uStack_37,cVar3);
    nk_memcopy(dst,&value,1);
    dst = (void *)((long)dst + 1);
LAB_0013e6a0:
    lVar7 = lVar7 + 4;
  } while( true );
}

Assistant:

NK_INTERN void
nk_draw_vertex_element(void *dst, const float *values, int value_count,
    enum nk_draw_vertex_layout_format format)
{
    int value_index;
    void *attribute = dst;
    /* if this triggers you tried to provide a color format for a value */
    NK_ASSERT(format < NK_FORMAT_COLOR_BEGIN);
    if (format >= NK_FORMAT_COLOR_BEGIN && format <= NK_FORMAT_COLOR_END) return;
    for (value_index = 0; value_index < value_count; ++value_index) {
        switch (format) {
        default: NK_ASSERT(0 && "invalid vertex layout format"); break;
        case NK_FORMAT_SCHAR: {
            char value = (char)NK_CLAMP((float)NK_SCHAR_MIN, values[value_index], (float)NK_SCHAR_MAX);
            NK_MEMCPY(attribute, &value, sizeof(value));
            attribute = (void*)((char*)attribute + sizeof(char));
        } break;
        case NK_FORMAT_SSHORT: {
            nk_short value = (nk_short)NK_CLAMP((float)NK_SSHORT_MIN, values[value_index], (float)NK_SSHORT_MAX);
            NK_MEMCPY(attribute, &value, sizeof(value));
            attribute = (void*)((char*)attribute + sizeof(value));
        } break;
        case NK_FORMAT_SINT: {
            nk_int value = (nk_int)NK_CLAMP((float)NK_SINT_MIN, values[value_index], (float)NK_SINT_MAX);
            NK_MEMCPY(attribute, &value, sizeof(value));
            attribute = (void*)((char*)attribute + sizeof(nk_int));
        } break;
        case NK_FORMAT_UCHAR: {
            unsigned char value = (unsigned char)NK_CLAMP((float)NK_UCHAR_MIN, values[value_index], (float)NK_UCHAR_MAX);
            NK_MEMCPY(attribute, &value, sizeof(value));
            attribute = (void*)((char*)attribute + sizeof(unsigned char));
        } break;
        case NK_FORMAT_USHORT: {
            nk_ushort value = (nk_ushort)NK_CLAMP((float)NK_USHORT_MIN, values[value_index], (float)NK_USHORT_MAX);
            NK_MEMCPY(attribute, &value, sizeof(value));
            attribute = (void*)((char*)attribute + sizeof(value));
            } break;
        case NK_FORMAT_UINT: {
            nk_uint value = (nk_uint)NK_CLAMP((float)NK_UINT_MIN, values[value_index], (float)NK_UINT_MAX);
            NK_MEMCPY(attribute, &value, sizeof(value));
            attribute = (void*)((char*)attribute + sizeof(nk_uint));
        } break;
        case NK_FORMAT_FLOAT:
            NK_MEMCPY(attribute, &values[value_index], sizeof(values[value_index]));
            attribute = (void*)((char*)attribute + sizeof(float));
            break;
        case NK_FORMAT_DOUBLE: {
            double value = (double)values[value_index];
            NK_MEMCPY(attribute, &value, sizeof(value));
            attribute = (void*)((char*)attribute + sizeof(double));
            } break;
        }
    }
}